

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Slot * __thiscall Model<Slot>::save(Model<Slot> *this)

{
  Slot *pSVar1;
  pair<int,_Slot> local_988;
  Model<Slot> *local_10;
  Model<Slot> *this_local;
  
  local_10 = this;
  pSVar1 = (Slot *)__dynamic_cast(this,&typeinfo,&Slot::typeinfo,0);
  if (pSVar1 == (Slot *)0x0) {
    __cxa_bad_cast();
  }
  std::pair<int,_Slot>::pair<int_&,_Slot_&,_true>(&local_988,&this->id,pSVar1);
  std::map<int,Slot,std::less<int>,std::allocator<std::pair<int_const,Slot>>>::
  insert<std::pair<int,Slot>>
            ((map<int,Slot,std::less<int>,std::allocator<std::pair<int_const,Slot>>> *)&objectList,
             &local_988);
  pSVar1 = (Slot *)__dynamic_cast(this,&typeinfo,&Slot::typeinfo,0);
  if (pSVar1 == (Slot *)0x0) {
    __cxa_bad_cast();
  }
  return pSVar1;
}

Assistant:

T &Model<T>::save() {
    Model<T>::objectList.insert(pair<int, T>(this->id, dynamic_cast<T &> (*this)));
    return dynamic_cast<T &> (*this);
}